

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kubernetes.hpp
# Opt level: O2

void sendNodesToSlack(string *hostname,string *channelName)

{
  string *psVar1;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  init;
  initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  init_00;
  initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  init_01;
  initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  init_02;
  initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  init_03;
  initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  init_04;
  allocator local_179;
  ulong local_178;
  string *local_170;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_168 [4];
  vector<Node_*,_std::allocator<Node_*>_> nodeList;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_110 [4];
  string currentNodeInfo;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_b0;
  undefined1 local_a0 [16];
  string local_90;
  Kube currentKube;
  
  local_170 = channelName;
  std::__cxx11::string::string((string *)(local_a0 + 0x10),(string *)hostname);
  Kube::Kube(&currentKube,(string *)(local_a0 + 0x10));
  std::__cxx11::string::~string((string *)(local_a0 + 0x10));
  std::vector<Node_*,_std::allocator<Node_*>_>::vector(&nodeList,&currentKube.nodeList);
  std::__cxx11::string::string((string *)&currentNodeInfo,"chat.postMessage",(allocator *)&local_b0)
  ;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json<const_char_(&)[5],_char[5],_0>(local_168 + 2,(char (*) [5])"text");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json<const_char_(&)[39],_char[39],_0>
            (local_168 + 3,(char (*) [39])"*NAME : STATUS : ROLE : AGE : VERSION*");
  init._M_len = 2;
  init._M_array = local_168 + 2;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(local_110,init,true,array);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json<const_char_(&)[8],_char[8],_0>(local_168,(char (*) [8])"channel");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (local_168 + 1,local_170);
  init_00._M_len = 2;
  init_00._M_array = local_168;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(local_110 + 1,init_00,true,array);
  init_01._M_len = 2;
  init_01._M_array = local_110;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(local_110 + 2,init_01,true,array);
  slack::_detail::post((string *)local_a0,(Json *)&currentNodeInfo);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_a0);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(local_110 + 2);
  lVar4 = 0x10;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)(&local_110[0].m_type + lVar4));
    lVar4 = lVar4 + -0x10;
  } while (lVar4 != -0x10);
  lVar4 = 0x10;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)(&local_168[0].m_type + lVar4));
    lVar4 = lVar4 + -0x10;
  } while (lVar4 != -0x10);
  lVar4 = 0x10;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)(&local_168[2].m_type + lVar4));
    lVar4 = lVar4 + -0x10;
  } while (lVar4 != -0x10);
  std::__cxx11::string::~string((string *)&currentNodeInfo);
  uVar3 = 0;
  while (uVar3 < (ulong)((long)nodeList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)nodeList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                               super__Vector_impl_data._M_start >> 3)) {
    local_178 = uVar3;
    psVar1 = (string *)
             std::__cxx11::string::append
                       ((char *)nodeList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                                .super__Vector_impl_data._M_start[uVar3]);
    pcVar2 = (char *)std::__cxx11::string::append(psVar1);
    psVar1 = (string *)std::__cxx11::string::append(pcVar2);
    pcVar2 = (char *)std::__cxx11::string::append(psVar1);
    psVar1 = (string *)std::__cxx11::string::append(pcVar2);
    pcVar2 = (char *)std::__cxx11::string::append(psVar1);
    psVar1 = (string *)std::__cxx11::string::append(pcVar2);
    psVar1 = (string *)std::__cxx11::string::append(psVar1);
    std::__cxx11::string::string((string *)&currentNodeInfo,psVar1);
    std::__cxx11::string::string((string *)local_110,"chat.postMessage",&local_179);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<const_char_(&)[5],_char[5],_0>(local_168,(char (*) [5])"text");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_168 + 1,&currentNodeInfo);
    init_02._M_len = 2;
    init_02._M_array = local_168;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(local_168 + 2,init_02,true,array);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<const_char_(&)[8],_char[8],_0>(local_110 + 2,(char (*) [8])"channel");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_110 + 3,local_170);
    init_03._M_len = 2;
    init_03._M_array = local_110 + 2;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(local_168 + 3,init_03,true,array);
    init_04._M_len = 2;
    init_04._M_array = local_168 + 2;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(&local_b0,init_04,true,array);
    slack::_detail::post((string *)&stack0xffffffffffffffc0,local_110);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)&stack0xffffffffffffffc0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_b0);
    lVar4 = 0x10;
    do {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)(&local_168[2].m_type + lVar4));
      lVar4 = lVar4 + -0x10;
    } while (lVar4 != -0x10);
    lVar4 = 0x10;
    do {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)(&local_110[2].m_type + lVar4));
      lVar4 = lVar4 + -0x10;
    } while (lVar4 != -0x10);
    lVar4 = 0x10;
    do {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)(&local_168[0].m_type + lVar4));
      lVar4 = lVar4 + -0x10;
    } while (lVar4 != -0x10);
    std::__cxx11::string::~string((string *)local_110);
    std::__cxx11::string::~string((string *)&currentNodeInfo);
    uVar3 = local_178 + 1;
  }
  std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
            (&nodeList.super__Vector_base<Node_*,_std::allocator<Node_*>_>);
  Kube::~Kube(&currentKube);
  return;
}

Assistant:

void sendNodesToSlack(string hostname, string channelName) {
	Kube currentKube(hostname);
	vector<Node*> nodeList = currentKube.nodeList;
	slack::post (   
                		"chat.postMessage",
                	{ 
						{"text"      , "*NAME : STATUS : ROLE : AGE : VERSION*" }, 
						{"channel"   , channelName             }
                	}
       				 );

	for (int i = 0; i < nodeList.size(); i++) {
		string currentNodeInfo = nodeList[i]->name.append(" : ").append(nodeList[i]->status).append(" : ").append(nodeList[i]->role).append(" : ").append(nodeList[i]->age).append(" : ").append(nodeList[i]->version);
		slack::post (   
                		"chat.postMessage",
                	{ 
						{"text"      , currentNodeInfo }, 
						{"channel"   , channelName             }
                	}
       				 );
	}
}